

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

lword readsection(GlobalVars *gv,uint8_t rtype,uint8_t *src,RelocInsert *ri)

{
  char cVar1;
  ushort uVar2;
  long x;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  lword lVar6;
  uint n;
  long v;
  
  cVar1 = gv->endianess;
  n = 0;
  v = 0;
  for (; ri != (RelocInsert *)0x0; ri = ri->next) {
    x = ri->mask;
    if (x == -1) {
      uVar2 = ri->bsiz;
      uVar4 = (uint)uVar2;
    }
    else {
      iVar3 = highest_bit_set(x);
      uVar4 = iVar3 + 1;
      uVar2 = ri->bsiz;
    }
    if ((int)n < (int)uVar4) {
      n = uVar4;
    }
    uVar5 = readreloc((uint)(cVar1 != '\0'),src,(uint)ri->bpos,(uint)uVar2);
    iVar3 = lshiftcnt(x);
    v = v + ((x >> ((byte)iVar3 & 0x3f) & uVar5) << ((byte)iVar3 & 0x3f));
  }
  if ((rtype < 0x22) && ((0x300000400U >> ((ulong)rtype & 0x3f) & 1) != 0)) {
    return v;
  }
  lVar6 = sign_extend(v,n);
  return lVar6;
}

Assistant:

lword readsection(struct GlobalVars *gv,uint8_t rtype,uint8_t *src,
                  struct RelocInsert *ri)
/* Read data from section at 'src', using the field-offsets, sizes and masks
   from the supplied list of RelocInsert structures. */
{
  int be = gv->endianess != _LITTLE_ENDIAN_;
  int maxfldsz = 0;
  lword data = 0;

  while (ri != NULL) {
    lword mask = ri->mask;
    lword v;
    int n;

    n = mask==-1 ? (int)ri->bsiz : highest_bit_set(mask) + 1;
    if (n > maxfldsz)
      maxfldsz = n;

    /* read from bitfield */
    v = readreloc(be,src,ri->bpos,ri->bsiz);

    /* mask and denormalize the read value using 'mask' */
    n = lshiftcnt(mask);
    mask >>= n;
    v &= mask;
    v <<= n;

    /* add to data value, next RelocInsert */
    data += v;
    ri = ri->next;
  }

  /* sign-extend, when needed */
  if (rtype!=R_SD && rtype!=R_SD2 && rtype!=R_SD21)
    return sign_extend(data,maxfldsz);

  return data;
}